

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# f_wipe.cpp
# Opt level: O3

void wipe_EndScreen(void)

{
  uint uVar1;
  uint uVar2;
  DFrameBuffer *pDVar3;
  int iVar4;
  ulong uVar5;
  
  pDVar3 = screen;
  if (CurrentWipeType != 0) {
    uVar1 = (screen->super_DSimpleCanvas).super_DCanvas.Width;
    uVar2 = (screen->super_DSimpleCanvas).super_DCanvas.Height;
    iVar4 = uVar2 * uVar1;
    uVar5 = 0xffffffffffffffff;
    if (-2 < iVar4) {
      uVar5 = (long)(iVar4 / 2) * 2;
    }
    wipe_scr_end = (short *)operator_new__(uVar5);
    (*(pDVar3->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xc])
              (pDVar3,0,0,(ulong)uVar1,(ulong)uVar2,wipe_scr_end);
    (*(screen->super_DSimpleCanvas).super_DCanvas.super_DObject._vptr_DObject[0xb])
              (screen,0,0,(ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Width,
               (ulong)(uint)(screen->super_DSimpleCanvas).super_DCanvas.Height,wipe_scr_start);
    (*wipes[CurrentWipeType * 3 + -3])(0);
    return;
  }
  return;
}

Assistant:

void wipe_EndScreen (void)
{
	if (CurrentWipeType)
	{
		wipe_scr_end = new short[SCREENWIDTH * SCREENHEIGHT / 2];
		screen->GetBlock (0, 0, SCREENWIDTH, SCREENHEIGHT, (BYTE *)wipe_scr_end);
		screen->DrawBlock (0, 0, SCREENWIDTH, SCREENHEIGHT, (BYTE *)wipe_scr_start); // restore start scr.
		// Initialize the wipe
		(*wipes[(CurrentWipeType-1)*3])(0);
	}
}